

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

void __thiscall nuraft::stat_elem::~stat_elem(stat_elem *this)

{
  long in_RDI;
  Histogram *this_00;
  
  this_00 = *(Histogram **)(in_RDI + 0x38);
  if (this_00 != (Histogram *)0x0) {
    Histogram::~Histogram(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

stat_elem::~stat_elem() {
    delete hist_;
}